

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O0

int __thiscall hwnet::Poller::notifyChannel::init(notifyChannel *this,EVP_PKEY_CTX *ctx)

{
  Poller *this_00;
  uint uVar1;
  ulong extraout_RAX;
  enable_shared_from_this<hwnet::Poller::notifyChannel> local_40;
  shared_ptr<hwnet::Channel> local_30;
  Poller *local_20;
  Poller *p_local;
  notifyChannel *this_local;
  ulong uVar2;
  
  local_20 = (Poller *)ctx;
  p_local = (Poller *)this;
  uVar1 = pipe2(this->notifyfds,0x80800);
  this_00 = local_20;
  uVar2 = (ulong)uVar1;
  if (uVar1 == 0) {
    std::enable_shared_from_this<hwnet::Poller::notifyChannel>::shared_from_this(&local_40);
    std::shared_ptr<hwnet::Channel>::shared_ptr<hwnet::Poller::notifyChannel,void>
              (&local_30,(shared_ptr<hwnet::Poller::notifyChannel> *)&local_40);
    Add(this_00,&local_30,2);
    std::shared_ptr<hwnet::Channel>::~shared_ptr(&local_30);
    std::shared_ptr<hwnet::Poller::notifyChannel>::~shared_ptr
              ((shared_ptr<hwnet::Poller::notifyChannel> *)&local_40);
    uVar2 = extraout_RAX;
  }
  return (int)CONCAT71((int7)(uVar2 >> 8),uVar1 == 0);
}

Assistant:

bool Poller::notifyChannel::init(Poller *p) {

#ifdef _LINUX
	if(pipe2(this->notifyfds,O_NONBLOCK | O_CLOEXEC) != 0) {
	    return false;	
	}
#elif _MACOS
	if(pipe(this->notifyfds) != 0){
		return false;
	}
	
	SetNoBlock(this->notifyfds[0],true);
	SetCloseOnExec(this->notifyfds[0]);

	SetNoBlock(this->notifyfds[1],true);
	SetCloseOnExec(this->notifyfds[1]);

#endif

	p->Add(shared_from_this(),Read);

	return true;	
}